

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-arithm.cpp
# Opt level: O2

void test_arithm<int>(uint length,int value1,int value2,bool allowTrash)

{
  int *piVar1;
  undefined1 (*pauVar2) [16];
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  int iVar21;
  int iVar22;
  int iVar23;
  int iVar24;
  int iVar25;
  int iVar26;
  int iVar27;
  int iVar28;
  int iVar29;
  int iVar30;
  int iVar31;
  int iVar32;
  int i;
  int *piVar33;
  undefined8 *puVar34;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var35;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var36;
  int *piVar37;
  undefined1 (*pauVar38) [16];
  ulong uVar39;
  int iVar40;
  long lVar41;
  int *piVar42;
  undefined1 (*pauVar43) [16];
  undefined1 (*pauVar44) [16];
  long lVar45;
  int i_7;
  int iVar46;
  ulong uVar47;
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  int *local_90;
  shared_ptr<int> pv1;
  shared_ptr<int> pv2;
  shared_ptr<int> presult;
  
  piVar33 = sse::common::malloc<int>(length);
  std::__shared_ptr<int,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<int,void(*)(int*),void>
            ((__shared_ptr<int,(__gnu_cxx::_Lock_policy)2> *)&local_90,piVar33,
             sse::common::free<int>);
  piVar33 = sse::common::malloc<int>(length);
  std::__shared_ptr<int,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<int,void(*)(int*),void>
            ((__shared_ptr<int,(__gnu_cxx::_Lock_policy)2> *)
             &pv1.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount,piVar33,
             sse::common::free<int>);
  piVar33 = sse::common::malloc<int>(length + 1);
  std::__shared_ptr<int,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<int,void(*)(int*),void>
            ((__shared_ptr<int,(__gnu_cxx::_Lock_policy)2> *)
             &pv2.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount,piVar33,
             sse::common::free<int>);
  uVar47 = (ulong)length;
  *(undefined4 *)
   ((long)&(pv2.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
           _vptr__Sp_counted_base + uVar47 * 4) = 0x7f;
  iVar46 = (int)length >> 2;
  piVar33 = local_90;
  for (iVar40 = iVar46; 3 < iVar40; iVar40 = iVar40 + -4) {
    *piVar33 = value1;
    piVar33[1] = value1;
    piVar33[2] = value1;
    piVar33[3] = value1;
    piVar33[4] = value1;
    piVar33[5] = value1;
    piVar33[6] = value1;
    piVar33[7] = value1;
    piVar33[8] = value1;
    piVar33[9] = value1;
    piVar33[10] = value1;
    piVar33[0xb] = value1;
    piVar33[0xc] = value1;
    piVar33[0xd] = value1;
    piVar33[0xe] = value1;
    piVar33[0xf] = value1;
    piVar33 = piVar33 + 0x10;
  }
  if (1 < iVar40) {
    *piVar33 = value1;
    piVar33[1] = value1;
    piVar33[2] = value1;
    piVar33[3] = value1;
    piVar33[4] = value1;
    piVar33[5] = value1;
    piVar33[6] = value1;
    piVar33[7] = value1;
    iVar40 = iVar40 + -2;
    piVar33 = piVar33 + 8;
  }
  if (iVar40 != 0) {
    *piVar33 = value1;
    piVar33[1] = value1;
    piVar33[2] = value1;
    piVar33[3] = value1;
  }
  lVar45 = (long)(int)length;
  presult.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(long)(int)(length & 0xfffffffc);
  for (p_Var35 = presult.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
      _Var36 = pv1.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount, iVar40 = iVar46,
      (long)p_Var35 < lVar45;
      p_Var35 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                ((long)&p_Var35->_vptr__Sp_counted_base + 1)) {
    local_90[(long)p_Var35] = value1;
  }
  for (; 3 < iVar40; iVar40 = iVar40 + -4) {
    *(int *)&(_Var36._M_pi)->_vptr__Sp_counted_base = value2;
    *(int *)((long)&(_Var36._M_pi)->_vptr__Sp_counted_base + 4) = value2;
    (_Var36._M_pi)->_M_use_count = value2;
    (_Var36._M_pi)->_M_weak_count = value2;
    *(int *)&_Var36._M_pi[1]._vptr__Sp_counted_base = value2;
    *(int *)((long)&_Var36._M_pi[1]._vptr__Sp_counted_base + 4) = value2;
    _Var36._M_pi[1]._M_use_count = value2;
    _Var36._M_pi[1]._M_weak_count = value2;
    *(int *)&_Var36._M_pi[2]._vptr__Sp_counted_base = value2;
    *(int *)((long)&_Var36._M_pi[2]._vptr__Sp_counted_base + 4) = value2;
    _Var36._M_pi[2]._M_use_count = value2;
    _Var36._M_pi[2]._M_weak_count = value2;
    *(int *)&_Var36._M_pi[3]._vptr__Sp_counted_base = value2;
    *(int *)((long)&_Var36._M_pi[3]._vptr__Sp_counted_base + 4) = value2;
    _Var36._M_pi[3]._M_use_count = value2;
    _Var36._M_pi[3]._M_weak_count = value2;
    _Var36._M_pi = _Var36._M_pi + 4;
  }
  if (1 < iVar40) {
    *(int *)&(_Var36._M_pi)->_vptr__Sp_counted_base = value2;
    *(int *)((long)&(_Var36._M_pi)->_vptr__Sp_counted_base + 4) = value2;
    (_Var36._M_pi)->_M_use_count = value2;
    (_Var36._M_pi)->_M_weak_count = value2;
    *(int *)&_Var36._M_pi[1]._vptr__Sp_counted_base = value2;
    *(int *)((long)&_Var36._M_pi[1]._vptr__Sp_counted_base + 4) = value2;
    _Var36._M_pi[1]._M_use_count = value2;
    _Var36._M_pi[1]._M_weak_count = value2;
    iVar40 = iVar40 + -2;
    _Var36._M_pi = _Var36._M_pi + 2;
  }
  p_Var35 = presult.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (iVar40 != 0) {
    *(int *)&(_Var36._M_pi)->_vptr__Sp_counted_base = value2;
    *(int *)((long)&(_Var36._M_pi)->_vptr__Sp_counted_base + 4) = value2;
    (_Var36._M_pi)->_M_use_count = value2;
    (_Var36._M_pi)->_M_weak_count = value2;
  }
  for (; (long)p_Var35 < lVar45;
      p_Var35 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                ((long)&p_Var35->_vptr__Sp_counted_base + 1)) {
    *(int *)((long)&(pv1.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
                    _vptr__Sp_counted_base + (long)p_Var35 * 4) = value2;
  }
  uVar39 = 0;
  while (uVar47 != uVar39) {
    if ((local_90[uVar39] != value1) ||
       (lVar41 = uVar39 * 4, uVar39 = uVar39 + 1,
       *(int *)((long)&(pv1.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
                       _vptr__Sp_counted_base + lVar41) != value2)) {
      puVar34 = (undefined8 *)__cxa_allocate_exception(0x10);
      *puVar34 = "void test_arithm(unsigned int, T, T, bool) [T = int]";
      *(undefined4 *)(puVar34 + 1) = 0x1a;
      *(uint *)((long)puVar34 + 0xc) = length;
      __cxa_throw(puVar34,&Exception::typeinfo,0);
    }
  }
  lVar41 = 0;
  for (iVar40 = iVar46; 3 < iVar40; iVar40 = iVar40 + -4) {
    piVar33 = (int *)((long)&(pv1.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                             _M_pi)->_vptr__Sp_counted_base + lVar41);
    iVar3 = piVar33[1];
    iVar4 = piVar33[2];
    iVar5 = piVar33[3];
    piVar37 = (int *)((long)&pv1.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                             _M_pi[1]._vptr__Sp_counted_base + lVar41);
    iVar6 = *piVar37;
    iVar7 = piVar37[1];
    iVar8 = piVar37[2];
    iVar9 = piVar37[3];
    piVar37 = (int *)((long)&pv1.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                             _M_pi[2]._vptr__Sp_counted_base + lVar41);
    iVar10 = *piVar37;
    iVar11 = piVar37[1];
    iVar12 = piVar37[2];
    iVar13 = piVar37[3];
    piVar37 = (int *)((long)&pv1.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                             _M_pi[3]._vptr__Sp_counted_base + lVar41);
    iVar14 = *piVar37;
    iVar15 = piVar37[1];
    iVar16 = piVar37[2];
    iVar17 = piVar37[3];
    piVar37 = (int *)((long)local_90 + lVar41);
    iVar18 = piVar37[1];
    iVar19 = piVar37[2];
    iVar20 = piVar37[3];
    piVar42 = (int *)((long)local_90 + lVar41 + 0x10);
    iVar21 = *piVar42;
    iVar22 = piVar42[1];
    iVar23 = piVar42[2];
    iVar24 = piVar42[3];
    piVar42 = (int *)((long)local_90 + lVar41 + 0x20);
    iVar25 = *piVar42;
    iVar26 = piVar42[1];
    iVar27 = piVar42[2];
    iVar28 = piVar42[3];
    piVar42 = (int *)((long)local_90 + lVar41 + 0x30);
    iVar29 = *piVar42;
    iVar30 = piVar42[1];
    iVar31 = piVar42[2];
    iVar32 = piVar42[3];
    piVar42 = (int *)((long)&(pv2.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                             _M_pi)->_vptr__Sp_counted_base + lVar41);
    *piVar42 = *piVar33 + *piVar37;
    piVar42[1] = iVar3 + iVar18;
    piVar42[2] = iVar4 + iVar19;
    piVar42[3] = iVar5 + iVar20;
    piVar33 = (int *)((long)&pv2.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                             _M_pi[1]._vptr__Sp_counted_base + lVar41);
    *piVar33 = iVar6 + iVar21;
    piVar33[1] = iVar7 + iVar22;
    piVar33[2] = iVar8 + iVar23;
    piVar33[3] = iVar9 + iVar24;
    piVar33 = (int *)((long)&pv2.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                             _M_pi[2]._vptr__Sp_counted_base + lVar41);
    *piVar33 = iVar10 + iVar25;
    piVar33[1] = iVar11 + iVar26;
    piVar33[2] = iVar12 + iVar27;
    piVar33[3] = iVar13 + iVar28;
    piVar33 = (int *)((long)&pv2.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                             _M_pi[3]._vptr__Sp_counted_base + lVar41);
    *piVar33 = iVar14 + iVar29;
    piVar33[1] = iVar15 + iVar30;
    piVar33[2] = iVar16 + iVar31;
    piVar33[3] = iVar17 + iVar32;
    lVar41 = lVar41 + 0x40;
  }
  if (iVar40 < 2) {
    piVar33 = (int *)((long)&(pv2.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                             _M_pi)->_vptr__Sp_counted_base + lVar41);
    piVar37 = (int *)((long)&(pv1.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                             _M_pi)->_vptr__Sp_counted_base + lVar41);
    piVar42 = (int *)(lVar41 + (long)local_90);
  }
  else {
    piVar1 = (int *)((long)&(pv1.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                            _M_pi)->_vptr__Sp_counted_base + lVar41);
    piVar37 = piVar1 + 8;
    iVar3 = piVar1[1];
    iVar4 = piVar1[2];
    iVar5 = piVar1[3];
    piVar33 = (int *)((long)&pv2.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                             _M_pi[2]._vptr__Sp_counted_base + lVar41);
    piVar42 = (int *)((long)local_90 + lVar41 + 0x20);
    iVar6 = piVar42[-7];
    iVar7 = piVar42[-6];
    iVar8 = piVar42[-5];
    piVar33[-8] = *piVar1 + piVar42[-8];
    piVar33[-7] = iVar3 + iVar6;
    piVar33[-6] = iVar4 + iVar7;
    piVar33[-5] = iVar5 + iVar8;
    iVar3 = piVar1[5];
    iVar4 = piVar1[6];
    iVar5 = piVar1[7];
    iVar6 = piVar42[-3];
    iVar7 = piVar42[-2];
    iVar8 = piVar42[-1];
    piVar33[-4] = piVar1[4] + piVar42[-4];
    piVar33[-3] = iVar3 + iVar6;
    piVar33[-2] = iVar4 + iVar7;
    piVar33[-1] = iVar5 + iVar8;
    iVar40 = iVar40 + -2;
  }
  if (iVar40 != 0) {
    iVar40 = piVar37[1];
    iVar3 = piVar37[2];
    iVar4 = piVar37[3];
    iVar5 = piVar42[1];
    iVar6 = piVar42[2];
    iVar7 = piVar42[3];
    *piVar33 = *piVar37 + *piVar42;
    piVar33[1] = iVar40 + iVar5;
    piVar33[2] = iVar3 + iVar6;
    piVar33[3] = iVar4 + iVar7;
  }
  for (p_Var35 = presult.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
      (long)p_Var35 < lVar45;
      p_Var35 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                ((long)&p_Var35->_vptr__Sp_counted_base + 1)) {
    *(int *)((long)&(pv2.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
                    _vptr__Sp_counted_base + (long)p_Var35 * 4) =
         *(int *)((long)&(pv1.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
                         ->_vptr__Sp_counted_base + (long)p_Var35 * 4) + local_90[(long)p_Var35];
  }
  uVar39 = 0;
  while (uVar47 != uVar39) {
    lVar41 = uVar39 * 4;
    uVar39 = uVar39 + 1;
    if (*(int *)((long)&(pv2.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
                        ->_vptr__Sp_counted_base + lVar41) != value2 + value1) {
      puVar34 = (undefined8 *)__cxa_allocate_exception(0x10);
      *puVar34 = "void test_arithm(unsigned int, T, T, bool) [T = int]";
      *(undefined4 *)(puVar34 + 1) = 0x22;
      *(uint *)((long)puVar34 + 0xc) = length;
      __cxa_throw(puVar34,&Exception::typeinfo,0);
    }
  }
  lVar41 = 0;
  for (iVar40 = iVar46; 3 < iVar40; iVar40 = iVar40 + -4) {
    piVar33 = (int *)((long)local_90 + lVar41);
    iVar3 = piVar33[1];
    iVar4 = piVar33[2];
    iVar5 = piVar33[3];
    piVar37 = (int *)((long)local_90 + lVar41 + 0x10);
    iVar6 = *piVar37;
    iVar7 = piVar37[1];
    iVar8 = piVar37[2];
    iVar9 = piVar37[3];
    piVar37 = (int *)((long)local_90 + lVar41 + 0x20);
    iVar10 = *piVar37;
    iVar11 = piVar37[1];
    iVar12 = piVar37[2];
    iVar13 = piVar37[3];
    piVar37 = (int *)((long)local_90 + lVar41 + 0x30);
    iVar14 = *piVar37;
    iVar15 = piVar37[1];
    iVar16 = piVar37[2];
    iVar17 = piVar37[3];
    piVar37 = (int *)((long)&(pv1.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                             _M_pi)->_vptr__Sp_counted_base + lVar41);
    iVar18 = piVar37[1];
    iVar19 = piVar37[2];
    iVar20 = piVar37[3];
    piVar42 = (int *)((long)&pv1.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                             _M_pi[1]._vptr__Sp_counted_base + lVar41);
    iVar21 = *piVar42;
    iVar22 = piVar42[1];
    iVar23 = piVar42[2];
    iVar24 = piVar42[3];
    piVar42 = (int *)((long)&pv1.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                             _M_pi[2]._vptr__Sp_counted_base + lVar41);
    iVar25 = *piVar42;
    iVar26 = piVar42[1];
    iVar27 = piVar42[2];
    iVar28 = piVar42[3];
    piVar42 = (int *)((long)&pv1.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                             _M_pi[3]._vptr__Sp_counted_base + lVar41);
    iVar29 = *piVar42;
    iVar30 = piVar42[1];
    iVar31 = piVar42[2];
    iVar32 = piVar42[3];
    piVar42 = (int *)((long)&(pv2.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                             _M_pi)->_vptr__Sp_counted_base + lVar41);
    *piVar42 = *piVar33 - *piVar37;
    piVar42[1] = iVar3 - iVar18;
    piVar42[2] = iVar4 - iVar19;
    piVar42[3] = iVar5 - iVar20;
    piVar33 = (int *)((long)&pv2.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                             _M_pi[1]._vptr__Sp_counted_base + lVar41);
    *piVar33 = iVar6 - iVar21;
    piVar33[1] = iVar7 - iVar22;
    piVar33[2] = iVar8 - iVar23;
    piVar33[3] = iVar9 - iVar24;
    piVar33 = (int *)((long)&pv2.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                             _M_pi[2]._vptr__Sp_counted_base + lVar41);
    *piVar33 = iVar10 - iVar25;
    piVar33[1] = iVar11 - iVar26;
    piVar33[2] = iVar12 - iVar27;
    piVar33[3] = iVar13 - iVar28;
    piVar33 = (int *)((long)&pv2.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                             _M_pi[3]._vptr__Sp_counted_base + lVar41);
    *piVar33 = iVar14 - iVar29;
    piVar33[1] = iVar15 - iVar30;
    piVar33[2] = iVar16 - iVar31;
    piVar33[3] = iVar17 - iVar32;
    lVar41 = lVar41 + 0x40;
  }
  if (iVar40 < 2) {
    piVar33 = (int *)((long)&(pv2.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                             _M_pi)->_vptr__Sp_counted_base + lVar41);
    piVar37 = (int *)((long)&(pv1.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                             _M_pi)->_vptr__Sp_counted_base + lVar41);
    piVar42 = (int *)(lVar41 + (long)local_90);
  }
  else {
    piVar1 = (int *)((long)&(pv1.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                            _M_pi)->_vptr__Sp_counted_base + lVar41);
    piVar37 = piVar1 + 8;
    piVar33 = (int *)((long)&pv2.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                             _M_pi[2]._vptr__Sp_counted_base + lVar41);
    piVar42 = (int *)((long)local_90 + lVar41 + 0x20);
    iVar3 = piVar42[-7];
    iVar4 = piVar42[-6];
    iVar5 = piVar42[-5];
    iVar6 = piVar1[1];
    iVar7 = piVar1[2];
    iVar8 = piVar1[3];
    piVar33[-8] = piVar42[-8] - *piVar1;
    piVar33[-7] = iVar3 - iVar6;
    piVar33[-6] = iVar4 - iVar7;
    piVar33[-5] = iVar5 - iVar8;
    iVar3 = piVar42[-3];
    iVar4 = piVar42[-2];
    iVar5 = piVar42[-1];
    iVar6 = piVar1[5];
    iVar7 = piVar1[6];
    iVar8 = piVar1[7];
    piVar33[-4] = piVar42[-4] - piVar1[4];
    piVar33[-3] = iVar3 - iVar6;
    piVar33[-2] = iVar4 - iVar7;
    piVar33[-1] = iVar5 - iVar8;
    iVar40 = iVar40 + -2;
  }
  if (iVar40 != 0) {
    iVar40 = piVar42[1];
    iVar3 = piVar42[2];
    iVar4 = piVar42[3];
    iVar5 = piVar37[1];
    iVar6 = piVar37[2];
    iVar7 = piVar37[3];
    *piVar33 = *piVar42 - *piVar37;
    piVar33[1] = iVar40 - iVar5;
    piVar33[2] = iVar3 - iVar6;
    piVar33[3] = iVar4 - iVar7;
  }
  for (p_Var35 = presult.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
      (long)p_Var35 < lVar45;
      p_Var35 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                ((long)&p_Var35->_vptr__Sp_counted_base + 1)) {
    *(int *)((long)&(pv2.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
                    _vptr__Sp_counted_base + (long)p_Var35 * 4) =
         local_90[(long)p_Var35] -
         *(int *)((long)&(pv1.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
                         ->_vptr__Sp_counted_base + (long)p_Var35 * 4);
  }
  uVar39 = 0;
  while (uVar47 != uVar39) {
    lVar41 = uVar39 * 4;
    uVar39 = uVar39 + 1;
    if (*(int *)((long)&(pv2.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
                        ->_vptr__Sp_counted_base + lVar41) != value1 - value2) {
      puVar34 = (undefined8 *)__cxa_allocate_exception(0x10);
      *puVar34 = "void test_arithm(unsigned int, T, T, bool) [T = int]";
      *(undefined4 *)(puVar34 + 1) = 0x2a;
      *(uint *)((long)puVar34 + 0xc) = length;
      __cxa_throw(puVar34,&Exception::typeinfo,0);
    }
  }
  lVar41 = 0;
  for (iVar40 = iVar46; 3 < iVar40; iVar40 = iVar40 + -4) {
    auVar48 = pmulld(*(undefined1 (*) [16])
                      ((long)&(pv1.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                              _M_pi)->_vptr__Sp_counted_base + lVar41),
                     *(undefined1 (*) [16])((long)local_90 + lVar41));
    auVar49 = pmulld(*(undefined1 (*) [16])
                      ((long)&pv1.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                              _M_pi[1]._vptr__Sp_counted_base + lVar41),
                     *(undefined1 (*) [16])((long)local_90 + lVar41 + 0x10));
    auVar50 = pmulld(*(undefined1 (*) [16])
                      ((long)&pv1.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                              _M_pi[2]._vptr__Sp_counted_base + lVar41),
                     *(undefined1 (*) [16])((long)local_90 + lVar41 + 0x20));
    auVar51 = pmulld(*(undefined1 (*) [16])
                      ((long)&pv1.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                              _M_pi[3]._vptr__Sp_counted_base + lVar41),
                     *(undefined1 (*) [16])((long)local_90 + lVar41 + 0x30));
    *(undefined1 (*) [16])
     ((long)&(pv2.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
             _vptr__Sp_counted_base + lVar41) = auVar48;
    *(undefined1 (*) [16])
     ((long)&pv2.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[1].
             _vptr__Sp_counted_base + lVar41) = auVar49;
    *(undefined1 (*) [16])
     ((long)&pv2.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[2].
             _vptr__Sp_counted_base + lVar41) = auVar50;
    *(undefined1 (*) [16])
     ((long)&pv2.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[3].
             _vptr__Sp_counted_base + lVar41) = auVar51;
    lVar41 = lVar41 + 0x40;
  }
  if (iVar40 < 2) {
    pauVar44 = (undefined1 (*) [16])
               ((long)&(pv2.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
                       _vptr__Sp_counted_base + lVar41);
    pauVar38 = (undefined1 (*) [16])
               ((long)&(pv1.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
                       _vptr__Sp_counted_base + lVar41);
    pauVar43 = (undefined1 (*) [16])(lVar41 + (long)local_90);
  }
  else {
    pauVar2 = (undefined1 (*) [16])
              ((long)&(pv1.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
                      _vptr__Sp_counted_base + lVar41);
    pauVar38 = pauVar2 + 2;
    pauVar44 = (undefined1 (*) [16])
               ((long)&pv2.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[2].
                       _vptr__Sp_counted_base + lVar41);
    pauVar43 = (undefined1 (*) [16])((long)local_90 + lVar41 + 0x20);
    auVar48 = pmulld(*pauVar2,pauVar43[-2]);
    pauVar44[-2] = auVar48;
    auVar48 = pmulld(pauVar2[1],pauVar43[-1]);
    pauVar44[-1] = auVar48;
    iVar40 = iVar40 + -2;
  }
  if (iVar40 != 0) {
    auVar48 = pmulld(*pauVar38,*pauVar43);
    *pauVar44 = auVar48;
  }
  for (p_Var35 = presult.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
      (long)p_Var35 < lVar45;
      p_Var35 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                ((long)&p_Var35->_vptr__Sp_counted_base + 1)) {
    *(int *)((long)&(pv2.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
                    _vptr__Sp_counted_base + (long)p_Var35 * 4) =
         *(int *)((long)&(pv1.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
                         ->_vptr__Sp_counted_base + (long)p_Var35 * 4) * local_90[(long)p_Var35];
  }
  uVar39 = 0;
  while (uVar47 != uVar39) {
    lVar41 = uVar39 * 4;
    uVar39 = uVar39 + 1;
    if (*(int *)((long)&(pv2.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
                        ->_vptr__Sp_counted_base + lVar41) != value2 * value1) {
      puVar34 = (undefined8 *)__cxa_allocate_exception(0x10);
      *puVar34 = "void test_arithm(unsigned int, T, T, bool) [T = int]";
      *(undefined4 *)(puVar34 + 1) = 0x32;
      *(uint *)((long)puVar34 + 0xc) = length;
      __cxa_throw(puVar34,&Exception::typeinfo,0);
    }
  }
  nosimd::arithmetic::div<int>
            (local_90,(int *)pv1.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                             _M_pi,
             (int *)pv2.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi,length
            );
  auVar48._4_4_ = value2;
  auVar48._0_4_ = value2;
  auVar48._8_4_ = value2;
  auVar48._12_4_ = value2;
  uVar39 = 0;
  while (uVar47 != uVar39) {
    lVar41 = uVar39 * 4;
    uVar39 = uVar39 + 1;
    if (*(int *)((long)&(pv2.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
                        ->_vptr__Sp_counted_base + lVar41) != value1 / value2) {
      puVar34 = (undefined8 *)__cxa_allocate_exception(0x10);
      *puVar34 = "void test_arithm(unsigned int, T, T, bool) [T = int]";
      *(undefined4 *)(puVar34 + 1) = 0x3a;
      *(uint *)((long)puVar34 + 0xc) = length;
      __cxa_throw(puVar34,&Exception::typeinfo,0);
    }
  }
  lVar41 = 0;
  for (iVar40 = iVar46; 3 < iVar40; iVar40 = iVar40 + -4) {
    piVar33 = (int *)((long)local_90 + lVar41);
    iVar3 = piVar33[1];
    iVar4 = piVar33[2];
    iVar5 = piVar33[3];
    piVar37 = (int *)((long)&(pv2.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                             _M_pi)->_vptr__Sp_counted_base + lVar41);
    *piVar37 = *piVar33 + value2;
    piVar37[1] = iVar3 + value2;
    piVar37[2] = iVar4 + value2;
    piVar37[3] = iVar5 + value2;
    piVar33 = (int *)((long)local_90 + lVar41 + 0x10);
    iVar3 = piVar33[1];
    iVar4 = piVar33[2];
    iVar5 = piVar33[3];
    piVar37 = (int *)((long)&pv2.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                             _M_pi[1]._vptr__Sp_counted_base + lVar41);
    *piVar37 = *piVar33 + value2;
    piVar37[1] = iVar3 + value2;
    piVar37[2] = iVar4 + value2;
    piVar37[3] = iVar5 + value2;
    piVar33 = (int *)((long)local_90 + lVar41 + 0x20);
    iVar3 = piVar33[1];
    iVar4 = piVar33[2];
    iVar5 = piVar33[3];
    piVar37 = (int *)((long)&pv2.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                             _M_pi[2]._vptr__Sp_counted_base + lVar41);
    *piVar37 = *piVar33 + value2;
    piVar37[1] = iVar3 + value2;
    piVar37[2] = iVar4 + value2;
    piVar37[3] = iVar5 + value2;
    piVar33 = (int *)((long)local_90 + lVar41 + 0x30);
    iVar3 = piVar33[1];
    iVar4 = piVar33[2];
    iVar5 = piVar33[3];
    piVar37 = (int *)((long)&pv2.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                             _M_pi[3]._vptr__Sp_counted_base + lVar41);
    *piVar37 = *piVar33 + value2;
    piVar37[1] = iVar3 + value2;
    piVar37[2] = iVar4 + value2;
    piVar37[3] = iVar5 + value2;
    lVar41 = lVar41 + 0x40;
  }
  if (iVar40 < 2) {
    piVar33 = (int *)((long)local_90 + lVar41);
    piVar37 = (int *)((long)&(pv2.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                             _M_pi)->_vptr__Sp_counted_base + lVar41);
  }
  else {
    piVar42 = (int *)((long)local_90 + lVar41);
    piVar33 = piVar42 + 8;
    iVar3 = piVar42[1];
    iVar4 = piVar42[2];
    iVar5 = piVar42[3];
    piVar37 = (int *)((long)&pv2.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                             _M_pi[2]._vptr__Sp_counted_base + lVar41);
    piVar37[-8] = *piVar42 + value2;
    piVar37[-7] = iVar3 + value2;
    piVar37[-6] = iVar4 + value2;
    piVar37[-5] = iVar5 + value2;
    iVar3 = piVar42[5];
    iVar4 = piVar42[6];
    iVar5 = piVar42[7];
    piVar37[-4] = piVar42[4] + value2;
    piVar37[-3] = iVar3 + value2;
    piVar37[-2] = iVar4 + value2;
    piVar37[-1] = iVar5 + value2;
    iVar40 = iVar40 + -2;
  }
  _Var36._M_pi = presult.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (iVar40 != 0) {
    iVar40 = piVar33[1];
    iVar3 = piVar33[2];
    iVar4 = piVar33[3];
    *piVar37 = *piVar33 + value2;
    piVar37[1] = iVar40 + value2;
    piVar37[2] = iVar3 + value2;
    piVar37[3] = iVar4 + value2;
  }
  for (; (long)_Var36._M_pi < lVar45;
      _Var36._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     ((long)&(_Var36._M_pi)->_vptr__Sp_counted_base + 1)) {
    *(int *)((long)&(pv2.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
                    _vptr__Sp_counted_base + (long)_Var36._M_pi * 4) =
         local_90[(long)_Var36._M_pi] + value2;
  }
  uVar39 = 0;
  while (uVar47 != uVar39) {
    lVar41 = uVar39 * 4;
    uVar39 = uVar39 + 1;
    if (*(int *)((long)&(pv2.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
                        ->_vptr__Sp_counted_base + lVar41) != value2 + value1) {
      puVar34 = (undefined8 *)__cxa_allocate_exception(0x10);
      *puVar34 = "void test_arithm(unsigned int, T, T, bool) [T = int]";
      *(undefined4 *)(puVar34 + 1) = 0x43;
      *(uint *)((long)puVar34 + 0xc) = length;
      __cxa_throw(puVar34,&Exception::typeinfo,0);
    }
  }
  lVar41 = 0;
  for (iVar40 = iVar46; 3 < iVar40; iVar40 = iVar40 + -4) {
    piVar33 = (int *)((long)local_90 + lVar41);
    iVar3 = piVar33[1];
    iVar4 = piVar33[2];
    iVar5 = piVar33[3];
    piVar37 = (int *)((long)&(pv2.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                             _M_pi)->_vptr__Sp_counted_base + lVar41);
    *piVar37 = *piVar33 - value2;
    piVar37[1] = iVar3 - value2;
    piVar37[2] = iVar4 - value2;
    piVar37[3] = iVar5 - value2;
    piVar33 = (int *)((long)local_90 + lVar41 + 0x10);
    iVar3 = piVar33[1];
    iVar4 = piVar33[2];
    iVar5 = piVar33[3];
    piVar37 = (int *)((long)&pv2.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                             _M_pi[1]._vptr__Sp_counted_base + lVar41);
    *piVar37 = *piVar33 - value2;
    piVar37[1] = iVar3 - value2;
    piVar37[2] = iVar4 - value2;
    piVar37[3] = iVar5 - value2;
    piVar33 = (int *)((long)local_90 + lVar41 + 0x20);
    iVar3 = piVar33[1];
    iVar4 = piVar33[2];
    iVar5 = piVar33[3];
    piVar37 = (int *)((long)&pv2.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                             _M_pi[2]._vptr__Sp_counted_base + lVar41);
    *piVar37 = *piVar33 - value2;
    piVar37[1] = iVar3 - value2;
    piVar37[2] = iVar4 - value2;
    piVar37[3] = iVar5 - value2;
    piVar33 = (int *)((long)local_90 + lVar41 + 0x30);
    iVar3 = piVar33[1];
    iVar4 = piVar33[2];
    iVar5 = piVar33[3];
    piVar37 = (int *)((long)&pv2.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                             _M_pi[3]._vptr__Sp_counted_base + lVar41);
    *piVar37 = *piVar33 - value2;
    piVar37[1] = iVar3 - value2;
    piVar37[2] = iVar4 - value2;
    piVar37[3] = iVar5 - value2;
    lVar41 = lVar41 + 0x40;
  }
  if (iVar40 < 2) {
    piVar33 = (int *)((long)local_90 + lVar41);
    piVar37 = (int *)((long)&(pv2.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                             _M_pi)->_vptr__Sp_counted_base + lVar41);
  }
  else {
    piVar42 = (int *)((long)local_90 + lVar41);
    piVar33 = piVar42 + 8;
    iVar3 = piVar42[1];
    iVar4 = piVar42[2];
    iVar5 = piVar42[3];
    piVar37 = (int *)((long)&pv2.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                             _M_pi[2]._vptr__Sp_counted_base + lVar41);
    piVar37[-8] = *piVar42 - value2;
    piVar37[-7] = iVar3 - value2;
    piVar37[-6] = iVar4 - value2;
    piVar37[-5] = iVar5 - value2;
    iVar3 = piVar42[5];
    iVar4 = piVar42[6];
    iVar5 = piVar42[7];
    piVar37[-4] = piVar42[4] - value2;
    piVar37[-3] = iVar3 - value2;
    piVar37[-2] = iVar4 - value2;
    piVar37[-1] = iVar5 - value2;
    iVar40 = iVar40 + -2;
  }
  _Var36._M_pi = presult.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (iVar40 != 0) {
    iVar40 = piVar33[1];
    iVar3 = piVar33[2];
    iVar4 = piVar33[3];
    *piVar37 = *piVar33 - value2;
    piVar37[1] = iVar40 - value2;
    piVar37[2] = iVar3 - value2;
    piVar37[3] = iVar4 - value2;
  }
  for (; (long)_Var36._M_pi < lVar45;
      _Var36._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     ((long)&(_Var36._M_pi)->_vptr__Sp_counted_base + 1)) {
    *(int *)((long)&(pv2.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
                    _vptr__Sp_counted_base + (long)_Var36._M_pi * 4) =
         local_90[(long)_Var36._M_pi] - value2;
  }
  uVar39 = 0;
  while (uVar47 != uVar39) {
    lVar41 = uVar39 * 4;
    uVar39 = uVar39 + 1;
    if (*(int *)((long)&(pv2.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
                        ->_vptr__Sp_counted_base + lVar41) != value1 - value2) {
      puVar34 = (undefined8 *)__cxa_allocate_exception(0x10);
      *puVar34 = "void test_arithm(unsigned int, T, T, bool) [T = int]";
      *(undefined4 *)(puVar34 + 1) = 0x4b;
      *(uint *)((long)puVar34 + 0xc) = length;
      __cxa_throw(puVar34,&Exception::typeinfo,0);
    }
  }
  lVar41 = 0;
  for (iVar40 = iVar46; 3 < iVar40; iVar40 = iVar40 + -4) {
    piVar33 = (int *)((long)local_90 + lVar41);
    iVar3 = piVar33[1];
    iVar4 = piVar33[2];
    iVar5 = piVar33[3];
    piVar37 = (int *)((long)&(pv2.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                             _M_pi)->_vptr__Sp_counted_base + lVar41);
    *piVar37 = value2 - *piVar33;
    piVar37[1] = value2 - iVar3;
    piVar37[2] = value2 - iVar4;
    piVar37[3] = value2 - iVar5;
    piVar33 = (int *)((long)local_90 + lVar41 + 0x10);
    iVar3 = piVar33[1];
    iVar4 = piVar33[2];
    iVar5 = piVar33[3];
    piVar37 = (int *)((long)&pv2.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                             _M_pi[1]._vptr__Sp_counted_base + lVar41);
    *piVar37 = value2 - *piVar33;
    piVar37[1] = value2 - iVar3;
    piVar37[2] = value2 - iVar4;
    piVar37[3] = value2 - iVar5;
    piVar33 = (int *)((long)local_90 + lVar41 + 0x20);
    iVar3 = piVar33[1];
    iVar4 = piVar33[2];
    iVar5 = piVar33[3];
    piVar37 = (int *)((long)&pv2.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                             _M_pi[2]._vptr__Sp_counted_base + lVar41);
    *piVar37 = value2 - *piVar33;
    piVar37[1] = value2 - iVar3;
    piVar37[2] = value2 - iVar4;
    piVar37[3] = value2 - iVar5;
    piVar33 = (int *)((long)local_90 + lVar41 + 0x30);
    iVar3 = piVar33[1];
    iVar4 = piVar33[2];
    iVar5 = piVar33[3];
    piVar37 = (int *)((long)&pv2.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                             _M_pi[3]._vptr__Sp_counted_base + lVar41);
    *piVar37 = value2 - *piVar33;
    piVar37[1] = value2 - iVar3;
    piVar37[2] = value2 - iVar4;
    piVar37[3] = value2 - iVar5;
    lVar41 = lVar41 + 0x40;
  }
  if (iVar40 < 2) {
    piVar33 = (int *)((long)local_90 + lVar41);
    piVar37 = (int *)((long)&(pv2.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                             _M_pi)->_vptr__Sp_counted_base + lVar41);
  }
  else {
    piVar42 = (int *)((long)local_90 + lVar41);
    piVar33 = piVar42 + 8;
    iVar3 = piVar42[1];
    iVar4 = piVar42[2];
    iVar5 = piVar42[3];
    piVar37 = (int *)((long)&pv2.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                             _M_pi[2]._vptr__Sp_counted_base + lVar41);
    piVar37[-8] = value2 - *piVar42;
    piVar37[-7] = value2 - iVar3;
    piVar37[-6] = value2 - iVar4;
    piVar37[-5] = value2 - iVar5;
    iVar3 = piVar42[5];
    iVar4 = piVar42[6];
    iVar5 = piVar42[7];
    piVar37[-4] = value2 - piVar42[4];
    piVar37[-3] = value2 - iVar3;
    piVar37[-2] = value2 - iVar4;
    piVar37[-1] = value2 - iVar5;
    iVar40 = iVar40 + -2;
  }
  if (iVar40 != 0) {
    iVar40 = piVar33[1];
    iVar3 = piVar33[2];
    iVar4 = piVar33[3];
    *piVar37 = value2 - *piVar33;
    piVar37[1] = value2 - iVar40;
    piVar37[2] = value2 - iVar3;
    piVar37[3] = value2 - iVar4;
  }
  for (_Var36._M_pi = presult.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
      (long)_Var36._M_pi < lVar45;
      _Var36._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     ((long)&(_Var36._M_pi)->_vptr__Sp_counted_base + 1)) {
    *(int *)((long)&(pv2.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
                    _vptr__Sp_counted_base + (long)_Var36._M_pi * 4) =
         value2 - local_90[(long)_Var36._M_pi];
  }
  uVar39 = 0;
  while (uVar47 != uVar39) {
    lVar41 = uVar39 * 4;
    uVar39 = uVar39 + 1;
    if (*(int *)((long)&(pv2.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
                        ->_vptr__Sp_counted_base + lVar41) != value2 - value1) {
      puVar34 = (undefined8 *)__cxa_allocate_exception(0x10);
      *puVar34 = "void test_arithm(unsigned int, T, T, bool) [T = int]";
      *(undefined4 *)(puVar34 + 1) = 0x53;
      *(uint *)((long)puVar34 + 0xc) = length;
      __cxa_throw(puVar34,&Exception::typeinfo,0);
    }
  }
  lVar41 = 0;
  for (; 3 < iVar46; iVar46 = iVar46 + -4) {
    auVar49 = pmulld(*(undefined1 (*) [16])((long)local_90 + lVar41),auVar48);
    *(undefined1 (*) [16])
     ((long)&(pv2.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
             _vptr__Sp_counted_base + lVar41) = auVar49;
    auVar49 = pmulld(*(undefined1 (*) [16])((long)local_90 + lVar41 + 0x10),auVar48);
    *(undefined1 (*) [16])
     ((long)&pv2.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[1].
             _vptr__Sp_counted_base + lVar41) = auVar49;
    auVar49 = pmulld(*(undefined1 (*) [16])((long)local_90 + lVar41 + 0x20),auVar48);
    *(undefined1 (*) [16])
     ((long)&pv2.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[2].
             _vptr__Sp_counted_base + lVar41) = auVar49;
    auVar49 = pmulld(*(undefined1 (*) [16])((long)local_90 + lVar41 + 0x30),auVar48);
    *(undefined1 (*) [16])
     ((long)&pv2.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[3].
             _vptr__Sp_counted_base + lVar41) = auVar49;
    lVar41 = lVar41 + 0x40;
  }
  if (iVar46 < 2) {
    pauVar44 = (undefined1 (*) [16])((long)local_90 + lVar41);
    pauVar38 = (undefined1 (*) [16])
               ((long)&(pv2.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
                       _vptr__Sp_counted_base + lVar41);
  }
  else {
    pauVar43 = (undefined1 (*) [16])((long)local_90 + lVar41);
    pauVar44 = pauVar43 + 2;
    auVar49 = pmulld(*pauVar43,auVar48);
    pauVar38 = (undefined1 (*) [16])
               ((long)&pv2.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[2].
                       _vptr__Sp_counted_base + lVar41);
    pauVar38[-2] = auVar49;
    auVar49 = pmulld(pauVar43[1],auVar48);
    pauVar38[-1] = auVar49;
    iVar46 = iVar46 + -2;
  }
  _Var36._M_pi = presult.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (iVar46 != 0) {
    auVar48 = pmulld(auVar48,*pauVar44);
    *pauVar38 = auVar48;
  }
  for (; (long)_Var36._M_pi < lVar45;
      _Var36._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     ((long)&(_Var36._M_pi)->_vptr__Sp_counted_base + 1)) {
    *(int *)((long)&(pv2.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
                    _vptr__Sp_counted_base + (long)_Var36._M_pi * 4) =
         local_90[(long)_Var36._M_pi] * value2;
  }
  uVar39 = 0;
  while (uVar47 != uVar39) {
    lVar45 = uVar39 * 4;
    uVar39 = uVar39 + 1;
    if (*(int *)((long)&(pv2.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
                        ->_vptr__Sp_counted_base + lVar45) != value2 * value1) {
      puVar34 = (undefined8 *)__cxa_allocate_exception(0x10);
      *puVar34 = "void test_arithm(unsigned int, T, T, bool) [T = int]";
      *(undefined4 *)(puVar34 + 1) = 0x5b;
      *(uint *)((long)puVar34 + 0xc) = length;
      __cxa_throw(puVar34,&Exception::typeinfo,0);
    }
  }
  nosimd::arithmetic::divC<int>
            (local_90,value2,
             (int *)pv2.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi,length
            );
  uVar39 = 0;
  while (uVar47 != uVar39) {
    lVar45 = uVar39 * 4;
    uVar39 = uVar39 + 1;
    if (*(int *)((long)&(pv2.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
                        ->_vptr__Sp_counted_base + lVar45) != value1 / value2) {
      puVar34 = (undefined8 *)__cxa_allocate_exception(0x10);
      *puVar34 = "void test_arithm(unsigned int, T, T, bool) [T = int]";
      *(undefined4 *)(puVar34 + 1) = 99;
      *(uint *)((long)puVar34 + 0xc) = length;
      __cxa_throw(puVar34,&Exception::typeinfo,0);
    }
  }
  nosimd::arithmetic::divCRev<int>
            (local_90,value2,
             (int *)pv2.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi,length
            );
  uVar39 = 0;
  while (uVar47 != uVar39) {
    lVar45 = uVar39 * 4;
    uVar39 = uVar39 + 1;
    if (*(int *)((long)&(pv2.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
                        ->_vptr__Sp_counted_base + lVar45) != value2 / value1) {
      puVar34 = (undefined8 *)__cxa_allocate_exception(0x10);
      *puVar34 = "void test_arithm(unsigned int, T, T, bool) [T = int]";
      *(undefined4 *)(puVar34 + 1) = 0x6b;
      *(uint *)((long)puVar34 + 0xc) = length;
      __cxa_throw(puVar34,&Exception::typeinfo,0);
    }
  }
  if ((!allowTrash) &&
     (*(int *)((long)&(pv2.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
                      _vptr__Sp_counted_base + uVar47 * 4) != 0x7f)) {
    puVar34 = (undefined8 *)__cxa_allocate_exception(0x10);
    *puVar34 = "void test_arithm(unsigned int, T, T, bool) [T = int]";
    *(undefined4 *)(puVar34 + 1) = 0x70;
    *(uint *)((long)puVar34 + 0xc) = length;
    __cxa_throw(puVar34,&Exception::typeinfo,0);
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&presult);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&pv2);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&pv1);
  return;
}

Assistant:

void test_arithm(unsigned length, T value1, T value2, bool allowTrash = false)
{
    auto pv1 = std::shared_ptr<T>(simd::malloc<T>(length), simd::free<T>);
    auto pv2 = std::shared_ptr<T>(simd::malloc<T>(length), simd::free<T>);
    auto presult = std::shared_ptr<T>(simd::malloc<T>(length+1), simd::free<T>);
    T * v1 = pv1.get();
    T * v2 = pv2.get();
    T * result = presult.get();
    result[length] = 0x7f;

    simd::set(value1, v1, length);
    simd::set(value2, v2, length);

    for (unsigned i = 0; i < length; ++i)
    {
        if (! equal(v1[i], value1) || ! equal(v2[i], value2))
            FAIL();
    }

    T r = value1 + value2;
    arithm::add(v1, v2, result, length);
    for (unsigned i = 0; i < length; ++i)
    {
        if (! equal(result[i], r))
            FAIL();
    }

    r = value1 - value2;
    arithm::sub(v1, v2, result, length);
    for (unsigned i = 0; i < length; ++i)
    {
        if (! equal(result[i], r))
            FAIL();
    }

    r = value1 * value2;
    arithm::mul(v1, v2, result, length);
    for (unsigned i = 0; i < length; ++i)
    {
        if (! equal(result[i], r))
            FAIL();
    }

    r = value1 / value2;
    arithm::div(v1, v2, result, length);
    for (unsigned i = 0; i < length; ++i)
    {
        if (! equal(result[i], r))
            FAIL();
    }

#ifndef TEST_FIXED
    r = value1 + value2;
    simd::addC(v1, value2, result, length);
    for (unsigned i = 0; i < length; ++i)
    {
        if (! equal(result[i], r))
            FAIL();
    }

    r = value1 - value2;
    simd::subC(v1, value2, result, length);
    for (unsigned i = 0; i < length; ++i)
    {
        if (result[i] != r)
            FAIL();
    }

    r = value2 - value1;
    simd::subCRev(v1, value2, result, length);
    for (unsigned i = 0; i < length; ++i)
    {
        if (! equal(result[i], r))
            FAIL();
    }

    r = value1 * value2;
    simd::mulC(v1, value2, result, length);
    for (unsigned i = 0; i < length; ++i)
    {
        if (result[i] != r)
            FAIL();
    }

    r = value1 / value2;
    simd::divC(v1, value2, result, length);
    for (unsigned i = 0; i < length; ++i)
    {
        if (! equal(result[i], r))
            FAIL();
    }

    r = value2 / value1;
    simd::divCRev(v1, value2, result, length);
    for (unsigned i = 0; i < length; ++i)
    {
        if (! equal(result[i], r))
            FAIL();
    }
#endif // TEST_FIXED

    if (!allowTrash && result[length] != 0x7f)
        FAIL();
}